

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

void __thiscall
ExchangeCompilation_TwoDefinitions_Test::TestBody(ExchangeCompilation_TwoDefinitions_Test *this)

{
  digest d;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  last_member;
  not_null<pstore::database_*> db;
  extent<pstore::repo::fragment> eVar1;
  shared_ptr<const_pstore::repo::compilation> *psVar2;
  typed_address<pstore::repo::fragment> tVar3;
  element_type *peVar4;
  uint generation;
  mapped_type *pmVar5;
  string *psVar6;
  parser<pstore::exchange::import_ns::callbacks> *ppVar7;
  definition *pdVar8;
  typed_address<pstore::indirect_string> tVar9;
  database *pdVar10;
  pointer *__ptr;
  _func_int **message;
  char *pcVar11;
  extent<pstore::repo::fragment> eVar12;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  initializer_list<pstore::repo::definition> __l;
  coord local_4f8;
  extent<pstore::repo::fragment> fext;
  shared_ptr<const_pstore::repo::compilation> compilation;
  mock_mutex mutex_1;
  uint uStack_4cc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4c8;
  mock_mutex mutex;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  undefined1 local_4a8 [16];
  digest fragment_digest;
  extent<pstore::repo::compilation> compilation_1;
  undefined1 local_470 [152];
  index_pointer local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  pointer local_3c0;
  index_pointer iStack_3b8;
  pointer local_3b0;
  pointer peStack_3a8;
  element_type *local_3a0;
  __uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  local_398;
  char *triple;
  char *name2;
  char *name1;
  const_iterator pos;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  digest compilation_digest;
  string_mapping imported_names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  string_mapping exported_names;
  array<const_char_*,_3UL> names;
  ostringstream exported_fragment_stream;
  ostringstream exported_compilation_stream;
  ostringstream exported_names_stream;
  
  name1 = "name1";
  name2 = "name2";
  triple = "triple";
  names._M_elems[2] = "name2";
  names._M_elems[0] = "triple";
  names._M_elems[1] = "name1";
  indir_strings._M_h._M_buckets = &indir_strings._M_h._M_single_bucket;
  indir_strings._M_h._M_bucket_count = 1;
  indir_strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indir_strings._M_h._M_element_count = 0;
  indir_strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indir_strings._M_h._M_rehash_policy._M_next_resize = 0;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar10 = &(this->super_ExchangeCompilation).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container = &indir_strings;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar10,names._M_elems,(char **)&exported_fragment_stream,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            (&exported_names,pdVar10);
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_names_stream);
  generation = pstore::database::get_current_revision(pdVar10);
  std::__cxx11::string::string((string *)&pos,"",(allocator *)&compilation_1);
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&exported_names_stream.super_ostream_base,(indent)0x0,pdVar10,generation,(string *)&pos
             ,&exported_names,false);
  std::__cxx11::string::~string((string *)&pos);
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  fragment_digest.v_._0_8_ = (address)0x12345678;
  fragment_digest.v_._8_8_ = (database *)0x9abcdef0;
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_compilation_stream);
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_fragment_stream);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,&mutex_1);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,pdVar10,(lock_type *)&pos
            );
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  compilation_1.addr.a_.a_._0_1_ = 2;
  memset(&compilation_1.size,0,0xa0);
  local_3d0._M_allocated_capacity = 0;
  local_3d0._8_8_ = (pointer)0x0;
  local_3c0 = (pointer)0x0;
  iStack_3b8.internal_ = (internal_node *)0x0;
  local_3b0 = (pointer)0x0;
  peStack_3a8 = (pointer)0x0;
  compilation_1.addr.a_.a_._1_1_ = 4;
  local_3d8.internal_ = (internal_node *)local_470;
  pstore::small_vector<unsigned_char,_128UL>::resize
            ((small_vector<unsigned_char,_128UL> *)&compilation_1.size,0x80);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_1_ = 2;
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__section_creation_dispatcher_00230b98;
  local_4f8 = (coord)&compilation_1;
  pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant
            ((not_null<const_pstore::repo::section_content_*> *)&local_4f8);
  pstore::repo::bss_section_creation_dispatcher::validate
            ((not_null<const_pstore::repo::section_content_*>)local_4f8);
  eVar12 = pstore::repo::fragment::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::repo::bss_section_creation_dispatcher*>
                     ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                      (bss_section_creation_dispatcher *)&compilation_index,
                      (bss_section_creation_dispatcher *)local_4a8);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&compilation,
             (database *)
             imported_names.adder_.views_.
             super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,true);
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)fragment_digest.v_._0_8_
  ;
  transaction.super_transaction_base.db_ = fragment_digest.v_._8_8_;
  transaction.super_transaction_base._16_16_ = eVar12;
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert<pstore::uint128,pstore::extent<pstore::repo::fragment>,void>
            ((pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
              *)&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                      *)CONCAT71(compilation.
                                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._1_7_,
                                 (char)compilation.
                                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr),(transaction_base *)&imported_names,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)&transaction);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                 *)&pos.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&compilation.
              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pstore::repo::section_creation_dispatcher::~section_creation_dispatcher
            ((section_creation_dispatcher *)&compilation_index);
  pstore::repo::section_content::~section_content((section_content *)&compilation_1);
  fext = eVar12;
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)&pos,(extent<pstore::repo::fragment> *)pdVar10);
  pstore::exchange::export_ns::emit_fragment
            (&exported_fragment_stream.super_ostream_base,(indent)0x0,pdVar10,&exported_names,
             (shared_ptr<const_pstore::repo::fragment> *)&pos,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pos.visited_parents_);
  eVar1 = fext;
  eVar12.size = (uint64_t)fragment_digest.v_._8_8_;
  eVar12.addr.a_.a_ = fragment_digest.v_._0_8_;
  tVar3.a_.a_ = fext.addr.a_.a_;
  std::__cxx11::string::string((string *)&compilation_1,"name1",(allocator *)&compilation);
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&compilation_1);
  d.v_._8_8_ = 1;
  d.v_._0_8_ = 4;
  pstore::repo::definition::definition
            ((definition *)&pos,d,eVar12,(typed_address<pstore::indirect_string>)tVar3.a_.a_,
             (linkage)eVar1.size,(visibility)(pmVar5->a_).a_);
  eVar12 = fext;
  eVar1.size = (uint64_t)fragment_digest.v_._8_8_;
  eVar1.addr.a_.a_ = fragment_digest.v_._0_8_;
  tVar3.a_.a_ = fext.addr.a_.a_;
  std::__cxx11::string::string((string *)&transaction,"name2",(allocator *)&local_4f8);
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&transaction);
  pstore::repo::definition::definition
            ((definition *)&pos.visited_parents_.c_._M_elems[2].position,(digest)ZEXT816(5),eVar1,
             (typed_address<pstore::indirect_string>)tVar3.a_.a_,(linkage)eVar12.size,
             (visibility)(pmVar5->a_).a_);
  __l._M_len = 2;
  __l._M_array = (iterator)&pos;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             &compilation_index,__l,(allocator_type *)(local_4a8 + 8));
  std::__cxx11::string::~string((string *)&transaction);
  std::__cxx11::string::~string((string *)&compilation_1);
  std::__cxx11::string::string((string *)&pos,"triple",(allocator *)&transaction);
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&pos);
  last_member._M_current._1_7_ =
       compilation_index.
       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._1_7_;
  last_member._M_current._0_1_ =
       compilation_index.
       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._0_1_;
  compilation_1 =
       pstore::repo::compilation::
       alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                 ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                  (typed_address<pstore::indirect_string>)(pmVar5->a_).a_,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )compilation_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,last_member);
  std::__cxx11::string::~string((string *)&pos);
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)&pos,(extent<pstore::repo::compilation> *)pdVar10);
  pcVar11 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            (&exported_compilation_stream.super_ostream_base,(indent)0x0,pdVar10,
             (compilation *)pos.db_,&exported_names,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pos.visited_parents_);
  pstore::transaction_base::commit((transaction_base *)&imported_names);
  std::_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::
  ~_Vector_base((_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *
                )&compilation_index);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,&mutex);
  pdVar10 = &(this->super_ExchangeCompilation).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar10,(lock_type *)&pos);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  anon_unknown.dwarf_9d963::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos,&transaction,&imported_names);
  psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
  ppVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar6);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar7);
  compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0;
  if ((bool)(char)compilation.
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compilation.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)transaction.super_transaction_base.db_;
    pstore::gsl::not_null<pstore::database_*>::ensure_invariant
              ((not_null<pstore::database_*> *)&compilation_index);
    db.ptr_._1_7_ =
         compilation_index.
         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._1_7_;
    db.ptr_._0_1_ =
         compilation_index.
         super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._0_1_;
    pstore::exchange::import_ns::callbacks::
    make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
              (db,(transaction<std::unique_lock<mock_mutex>_> *)
                  compilation_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(string_mapping *)_Stack_4c8._M_pi,(uint128 *)_mutex_1);
    pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
              ((parser<pstore::exchange::import_ns::callbacks> *)&pos,(callbacks *)&compilation_1,
               none);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&compilation_1.size);
    psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    ppVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar6);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar7);
    compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_1_ = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0;
    if ((bool)(char)compilation.
                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&compilation.
                        super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
      pstore::index::
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&compilation,pdVar10,true);
      anon_unknown.dwarf_9d963::import_compilation_parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&pos,&transaction,&imported_names
                 ,(shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&compilation,&compilation_digest);
      psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         (&exported_compilation_stream);
      ppVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                         ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar6);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar7);
      fext.addr.a_.a_._1_7_ = fext.addr.a_.a_._1_7_;
      fext.addr.a_.a_._0_1_ = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0;
      fext.size = 0;
      if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fext.size);
        pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                  ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&compilation.
                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pstore::index::
        get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((index *)&compilation_index,pdVar10,true);
        pstore::index::
        hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
        ::find<pstore::uint128,void>
                  (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                         *)compilation_index.
                           super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,pdVar10,&compilation_digest);
        peVar4 = compilation_index.
                 super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        memset(&compilation_1.size,0,0xd8);
        compilation_1.addr.a_.a_ = (address)(address)pdVar10;
        local_3a0 = peVar4;
        local_398._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
        ._M_head_impl =
             (tuple<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
              )(_Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                )0x0;
        tVar9.a_.a_ = (address)&pos;
        testing::internal::
        CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                  ((internal *)&compilation,"pos","compilation_index->end (import_db_)",
                   (iterator_base<true> *)tVar9.a_.a_,(iterator_base<false> *)&compilation_1);
        std::
        unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        ::~unique_ptr((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                       *)&local_398);
        if ((char)compilation.
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == '\0') {
          testing::Message::Message((Message *)&compilation_1);
          std::operator<<((ostream *)((long)compilation_1.addr.a_.a_ + 0x10),
                          "Compilation was not found in the index after import");
          message = (_func_int **)0x1c5bef;
          if (compilation.
              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            message = (compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_vptr__Sp_counted_base;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&fext,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0x128,(char *)message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&fext,(Message *)&compilation_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fext);
          if (compilation_1.addr.a_.a_ != 0) {
            (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&compilation.
                            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&compilation.
                            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
          pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::iterator_base<true>::operator*(&pos);
          pstore::database::getro<pstore::repo::compilation,void>
                    ((database *)&compilation,(extent<pstore::repo::compilation> *)pdVar10);
          (anonymous_namespace)::load_string_abi_cxx11_
                    ((string *)&compilation_1,(_anonymous_namespace_ *)pdVar10,
                     *(database **)
                      (CONCAT71(compilation.
                                super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr._1_7_,
                                (char)compilation.
                                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr) + 8),tVar9);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                    ((internal *)&fext,"load_string (import_db_, compilation->triple ())","triple",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilation_1,&triple);
          std::__cxx11::string::~string((string *)&compilation_1);
          if ((byte)fext.addr.a_.a_ == '\0') {
            testing::Message::Message((Message *)&compilation_1);
            if (fext.size == 0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)fext.size;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,300,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4f8,(Message *)&compilation_1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
            if (compilation_1.addr.a_.a_ != 0) {
              (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fext.size);
          fext.addr.a_.a_._0_4_ =
               *(undefined4 *)
                (CONCAT71(compilation.
                          super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._1_7_,
                          (char)compilation.
                                super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr) + 0x10);
          local_4f8.column = 2;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&compilation_1,"compilation->size ()","2U",(uint *)&fext,
                     &local_4f8.column);
          if ((char)compilation_1.addr.a_.a_ == '\0') {
            testing::Message::Message((Message *)&fext);
            if (compilation_1.size == 0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)compilation_1.size;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,0x12d,pcVar11);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_4f8,(Message *)&fext);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
            if (fext.addr.a_.a_ != 0) {
              (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            pdVar8 = pstore::repo::compilation::operator[]
                               ((compilation *)
                                CONCAT71(compilation.
                                         super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._1_7_,
                                         (char)compilation.
                                               super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr),0);
            tVar9.a_.a_ = (address)(address)pdVar8;
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def1.digest","fragment_digest",&pdVar8->digest,
                       &fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              tVar9.a_.a_ = (address)0x130;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x130,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            (anonymous_namespace)::load_string_abi_cxx11_
                      ((string *)&compilation_1,(_anonymous_namespace_ *)pdVar10,
                       (database *)(pdVar8->name).a_.a_,tVar9);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&fext,"load_string (import_db_, def1.name)","name1",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name1);
            std::__cxx11::string::~string((string *)&compilation_1);
            if ((byte)fext.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&compilation_1);
              if (fext.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)fext.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x131,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&fext.size);
            fext.addr.a_.a_._0_1_ = (pdVar8->field_3).bf & 0xf;
            local_4f8.column._0_1_ = 4;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def1.linkage ()",
                       "pstore::repo::linkage::external",(linkage *)&fext,(linkage *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x132,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            fext.addr.a_.a_._0_1_ = (pdVar8->field_3).bf >> 4 & 3;
            local_4f8.column._0_1_ = 1;
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def1.visibility ()",
                       "pstore::repo::visibility::hidden_vis",(visibility *)&fext,
                       (visibility *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x133,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            pdVar8 = pstore::repo::compilation::operator[]
                               ((compilation *)
                                CONCAT71(compilation.
                                         super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._1_7_,
                                         (char)compilation.
                                               super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr),1);
            tVar9.a_.a_ = (address)(address)pdVar8;
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def2.digest","fragment_digest",&pdVar8->digest,
                       &fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              tVar9.a_.a_ = (address)0x137;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x137,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            (anonymous_namespace)::load_string_abi_cxx11_
                      ((string *)&compilation_1,(_anonymous_namespace_ *)pdVar10,
                       (database *)(pdVar8->name).a_.a_,tVar9);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&fext,"load_string (import_db_, def2.name)","name2",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name2);
            std::__cxx11::string::~string((string *)&compilation_1);
            if ((byte)fext.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&compilation_1);
              if (fext.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)fext.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x138,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&fext.size);
            fext.addr.a_.a_._0_1_ = (pdVar8->field_3).bf & 0xf;
            local_4f8.column._0_1_ = 5;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def2.linkage ()",
                       "pstore::repo::linkage::link_once_any",(linkage *)&fext,(linkage *)&local_4f8
                      );
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x139,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            fext.addr.a_.a_._0_1_ = (pdVar8->field_3).bf >> 4 & 3;
            local_4f8 = (coord)((ulong)local_4f8 & 0xffffffffffffff00);
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def2.visibility ()",
                       "pstore::repo::visibility::default_vis",(visibility *)&fext,
                       (visibility *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&fext);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x13a,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4f8,(Message *)&fext);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
              if (fext.addr.a_.a_ != 0) {
                (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&compilation_1.size);
            pstore::transaction_base::commit(&transaction.super_transaction_base);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&compilation.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::
        unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        ::~unique_ptr(&pos.pos_);
        psVar2 = (shared_ptr<const_pstore::repo::compilation> *)&compilation_index;
      }
      else {
        testing::Message::Message((Message *)&local_4f8);
        std::operator<<((ostream *)((long)local_4f8 + 0x10),"JSON error was: ");
        (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
                  (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
                   pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
        std::operator<<((ostream *)((long)local_4f8 + 0x10),(string *)&compilation_1);
        std::operator<<((ostream *)((long)local_4f8 + 0x10),' ');
        _mutex_1 = (undefined4)pos.visited_parents_.c_._M_elems[9].position;
        uStack_4cc = pos.visited_parents_.c_._M_elems[9].position._4_4_;
        pstore::json::operator<<((ostream *)((long)local_4f8 + 0x10),(coord *)&mutex_1);
        std::operator<<((ostream *)((long)local_4f8 + 0x10),'\n');
        psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                           (&exported_compilation_stream);
        std::operator<<((ostream *)((long)local_4f8 + 0x10),(string *)psVar6);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&compilation_index,(internal *)&fext,
                   (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar11);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_4a8 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0x11e,(char *)compilation_index.
                                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_4a8 + 8),(Message *)&local_4f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_4a8 + 8));
        std::__cxx11::string::~string((string *)&compilation_index);
        std::__cxx11::string::~string((string *)&compilation_1);
        if (local_4f8 != (coord)0x0) {
          (**(code **)(*(long *)local_4f8 + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fext.size);
        pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                  ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
        psVar2 = &compilation;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(psVar2->
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      goto LAB_00137082;
    }
    testing::Message::Message((Message *)&fext);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),"JSON error was: ");
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),(string *)&compilation_1);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),' ');
    local_4f8.column = (undefined4)pos.visited_parents_.c_._M_elems[9].position;
    local_4f8.row = pos.visited_parents_.c_._M_elems[9].position._4_4_;
    pstore::json::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),&local_4f8);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),'\n');
    psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),(string *)psVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&compilation_index,(internal *)&compilation,
               (AssertionResult *)"fragment_parser.has_error ()","true","false",pcVar11);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x113,(char *)compilation_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex_1,(Message *)&fext);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex_1);
    std::__cxx11::string::~string((string *)&compilation_index);
    std::__cxx11::string::~string((string *)&compilation_1);
    if (fext.addr.a_.a_ != 0) {
      (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
    }
  }
  else {
    testing::Message::Message((Message *)&fext);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),"JSON error was: ");
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),(string *)&compilation_1);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),' ');
    local_4f8.column = (undefined4)pos.visited_parents_.c_._M_elems[9].position;
    local_4f8.row = pos.visited_parents_.c_._M_elems[9].position._4_4_;
    pstore::json::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),&local_4f8);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),'\n');
    psVar6 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
    std::operator<<((ostream *)((long)fext.addr.a_.a_ + 0x10),(string *)psVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&compilation_index,(internal *)&compilation,
               (AssertionResult *)"name_parser.has_error ()","true","false",pcVar11);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x10a,(char *)compilation_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex_1,(Message *)&fext);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex_1);
    std::__cxx11::string::~string((string *)&compilation_index);
    std::__cxx11::string::~string((string *)&compilation_1);
    if (fext.addr.a_.a_ != 0) {
      (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&compilation.
                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
LAB_00137082:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_fragment_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_compilation_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_names_stream);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&exported_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&indir_strings._M_h);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, TwoDefinitions) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    constexpr auto * triple = "triple";
    constexpr auto name_index = pstore::trailer::indices::name;

    std::array<pstore::gsl::czstring, 3> names{{triple, name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    // Now build a single fragment and a compilation that references it then export them.
    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    constexpr pstore::index::digest fragment_digest{0x9ABCDEF0, 0x12345678};

    export_ns::ostringstream exported_compilation_stream;
    export_ns::ostringstream exported_fragment_stream;

    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        pstore::extent<pstore::repo::fragment> const fext =
            build_fragment (transaction, fragment_digest);
        emit_fragment (exported_fragment_stream, export_ns::indent{}, export_db_, exported_names,
                       export_db_.getro (fext), comments);

        std::vector<pstore::repo::definition> definitions{
            {fragment_digest, fext, indir_strings[name1], pstore::repo::linkage::external,
             pstore::repo::visibility::hidden_vis},
            {fragment_digest, fext, indir_strings[name2], pstore::repo::linkage::link_once_any,
             pstore::repo::visibility::default_vis},
        };
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }


    // Now begin to export the three pieces: the names, the fragment, and finally the compilation.
    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});


    import_ns::string_mapping imported_names;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();
    }
    {
        auto fragment_parser =
            import_fragment_parser (&transaction, &imported_names, &fragment_digest);
        fragment_parser.input (exported_fragment_stream.str ()).eof ();
        ASSERT_FALSE (fragment_parser.has_error ())
            << "JSON error was: " << fragment_parser.last_error ().message () << ' '
            << fragment_parser.coordinate () << '\n'
            << exported_fragment_stream.str ();
    }
    {
        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();
    }

    // Everything is now imported. Let's check what the resulting compilation record looks like.
    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";

    auto const compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, compilation->triple ()), triple);
    ASSERT_EQ (compilation->size (), 2U);
    {
        pstore::repo::definition const & def1 = (*compilation)[0];
        EXPECT_EQ (def1.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def1.name), name1);
        EXPECT_EQ (def1.linkage (), pstore::repo::linkage::external);
        EXPECT_EQ (def1.visibility (), pstore::repo::visibility::hidden_vis);
    }
    {
        pstore::repo::definition const & def2 = (*compilation)[1];
        EXPECT_EQ (def2.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def2.name), name2);
        EXPECT_EQ (def2.linkage (), pstore::repo::linkage::link_once_any);
        EXPECT_EQ (def2.visibility (), pstore::repo::visibility::default_vis);
    }

    transaction.commit ();
}